

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

FILETIME FILEUnixTimeToFileTime(time_t sec,long nsec)

{
  long Result;
  long nsec_local;
  time_t sec_local;
  FILETIME Ret;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  return (FILETIME)((sec + 0x2b6109100) * 10000000 + nsec / 100);
}

Assistant:

FILETIME FILEUnixTimeToFileTime( time_t sec, long nsec )
{
    __int64 Result;
    FILETIME Ret;

    Result = ((__int64)sec + SECS_BETWEEN_1601_AND_1970_EPOCHS) * SECS_TO_100NS +
        (nsec / 100);

    Ret.dwLowDateTime = (DWORD)Result;
    Ret.dwHighDateTime = (DWORD)(Result >> 32);

    TRACE("Unix time = [%ld.%09ld] converts to Win32 FILETIME = [%#x:%#x]\n", 
          sec, nsec, Ret.dwHighDateTime, Ret.dwLowDateTime);

    return Ret;
}